

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.h
# Opt level: O0

void lowbd_write_buffer_16xn_avx2(__m256i *in,uint8_t *output,int stride,int flipud,int height)

{
  __m256i res;
  int in_R8D;
  int i;
  int step;
  int j;
  longlong in_stack_00000038;
  int local_28;
  
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    res[0]._4_4_ = stride;
    res[0]._0_4_ = flipud;
    res[1] = (longlong)output;
    res[2] = (longlong)in;
    res[3] = in_stack_00000038;
    write_recon_w16_avx2(res,(uint8_t *)CONCAT44(height,j));
  }
  return;
}

Assistant:

static inline void lowbd_write_buffer_16xn_avx2(__m256i *in, uint8_t *output,
                                                int stride, int flipud,
                                                int height) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    write_recon_w16_avx2(in[j], output + i * stride);
  }
}